

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O2

void test_read_until_second_read_in_callback(void)

{
  cio_buffered_stream *buffered_stream;
  int iVar1;
  cio_error cVar2;
  memory_stream *ms;
  char delim2 [6];
  cio_read_buffer rb;
  uint8_t buffer [40];
  uint8_t local_30 [8];
  
  builtin_strncpy(delim2,"Stuff",6);
  ms = (memory_stream *)malloc(0x100);
  iVar1 = memory_stream_init(ms,"MYHelloWorldYourStuffExample");
  UnityAssertEqualNumber
            (0,(long)iVar1,"Could not allocate memory for test!",0x4ab,UNITY_DISPLAY_STYLE_INT);
  read_some_fake.custom_fake = read_some_max;
  dummy_read_handler_fake.custom_fake = save_to_check_buffer_and_read_until_again;
  second_dummy_read_handler_fake.custom_fake = save_to_second_check_buffer;
  rb.data = buffer;
  rb.end = local_30;
  rb.add_ptr = rb.data;
  rb.fetch_ptr = rb.data;
  UnityAssertEqualNumber
            (0,0,"Read buffer was not initialized correctly!",0x4b3,UNITY_DISPLAY_STYLE_INT);
  buffered_stream = (cio_buffered_stream *)(ms + 1);
  cVar2 = cio_buffered_stream_init(buffered_stream,(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Buffer was not initialized correctly!",0x4b6,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_read_until(buffered_stream,&rb,"HelloWorld",dummy_read_handler,delim2)
  ;
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x4b9,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)dummy_read_handler_fake.call_count,"Handler was not called!",0x4bb,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)dummy_read_handler_fake.arg2_val,"Handler was not called with CIO_SUCCESS!",
             0x4bc,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&rb,(UNITY_INT)dummy_read_handler_fake.arg3_val,
             "Handler was not called with original read buffer!",0x4bd,UNITY_DISPLAY_STYLE_INT);
  iVar1 = bcmp(first_check_buffer,"MYHelloWorld",0xc);
  if (iVar1 != 0) {
    UnityFail("Handler was not called with correct data!",0x4be);
  }
  UnityAssertEqualNumber
            (1,(ulong)second_dummy_read_handler_fake.call_count,"Second handler was not called!",
             0x4c0,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)second_dummy_read_handler_fake.arg2_val,
             "Second handler was not called with CIO_SUCCESS!",0x4c1,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&rb,(UNITY_INT)second_dummy_read_handler_fake.arg3_val,
             "Second handler was not called with original read buffer!",0x4c2,
             UNITY_DISPLAY_STYLE_INT);
  iVar1 = bcmp(second_check_buffer,"YourStuff",9);
  if (iVar1 == 0) {
    cVar2 = cio_buffered_stream_close(buffered_stream);
    UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x4c6,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x4c7,
               UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("Second handler was not called with correct data!",0x4c3);
}

Assistant:

static void test_read_until_second_read_in_callback(void)
{
#define PRE_DELIM1 "MY"
#define DELIM1 "HelloWorld"
#define PRE_DELIM2 "Your"
#define DELIM2 "Stuff"
	char delim2[] = DELIM2;

	struct client *client = malloc(sizeof(*client));

	static const char *test_data = PRE_DELIM1 DELIM1 PRE_DELIM2 DELIM2 "Example";
	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, test_data), "Could not allocate memory for test!");
	read_some_fake.custom_fake = read_some_max;
	dummy_read_handler_fake.custom_fake = save_to_check_buffer_and_read_until_again;
	second_dummy_read_handler_fake.custom_fake = save_to_second_check_buffer;

	uint8_t buffer[40];
	struct cio_read_buffer rb;
	enum cio_error err = cio_read_buffer_init(&rb, &buffer, sizeof(buffer));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Read buffer was not initialized correctly!");

	err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");

	err = cio_buffered_stream_read_until(&client->bs, &rb, DELIM1, dummy_read_handler, delim2);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");

	TEST_ASSERT_EQUAL_MESSAGE(1, dummy_read_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, dummy_read_handler_fake.arg2_val, "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_EQUAL_MESSAGE(&rb, dummy_read_handler_fake.arg3_val, "Handler was not called with original read buffer!");
	TEST_ASSERT_MESSAGE(memcmp((const char *)first_check_buffer, PRE_DELIM1 DELIM1, strlen(PRE_DELIM1) + strlen(DELIM1)) == 0, "Handler was not called with correct data!");

	TEST_ASSERT_EQUAL_MESSAGE(1, second_dummy_read_handler_fake.call_count, "Second handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, second_dummy_read_handler_fake.arg2_val, "Second handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_EQUAL_MESSAGE(&rb, second_dummy_read_handler_fake.arg3_val, "Second handler was not called with original read buffer!");
	TEST_ASSERT_MESSAGE(memcmp((const char *)second_check_buffer, PRE_DELIM2 DELIM2, strlen(PRE_DELIM2) + strlen(DELIM2)) == 0, "Second handler was not called with correct data!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
}